

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<VkSpecParser::TypedName>::relocate
          (QArrayDataPointer<VkSpecParser::TypedName> *this,qsizetype offset,TypedName **data)

{
  bool bVar1;
  TypedName *in_RDX;
  long in_RSI;
  TypedName *in_RDI;
  TypedName **unaff_retaddr;
  TypedName *res;
  char16_t *n;
  TypedName *c;
  
  n = (in_RDI->name).d.ptr + in_RSI * 0x24;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<VkSpecParser::TypedName,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (TypedName *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<VkSpecParser::TypedName>,VkSpecParser::TypedName_const*>
                        (unaff_retaddr,(QArrayDataPointer<VkSpecParser::TypedName> *)c), bVar1)) {
    (in_RDX->name).d.d = (Data *)(in_RSI * 0x48 + (long)(in_RDX->name).d.d);
  }
  (in_RDI->name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }